

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ForkBranch<capnproto_test::capnp::test::TestInterface::Client,_true>::get
          (ForkBranch<capnproto_test::capnp::test::TestInterface::Client,_true> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *pEVar1;
  ArrayDisposer *pAVar2;
  undefined8 *puVar3;
  pointer_____offset_0x10___ puVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long *plVar8;
  undefined8 local_38;
  undefined8 local_30;
  long *local_28;
  
  pEVar1 = ((this->super_ForkBranchBase).hub.ptr)->resultRef;
  if (pEVar1[1].exception.ptr.isSet == true) {
    (**(code **)(**(long **)((long)&pEVar1[1].exception.ptr.field_1 +
                            *(long *)(pEVar1[1].exception.ptr.field_1.value.ownFile.content.ptr +
                                     -0x18) + 8) + 0x20))(&local_30);
    local_38 = &capnp::Capability::Client::typeinfo;
    if (output[1].exception.ptr.isSet == true) {
      output[1].exception.ptr.isSet = false;
      pAVar2 = output[1].exception.ptr.field_1.value.ownFile.content.disposer;
      if (pAVar2 != (ArrayDisposer *)0x0) {
        output[1].exception.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
        puVar3 = (undefined8 *)output[1].exception.ptr.field_1.value.ownFile.content.size_;
        (**(code **)*puVar3)
                  (puVar3,pAVar2->_vptr_ArrayDisposer[-2] + (long)&pAVar2->_vptr_ArrayDisposer);
      }
    }
    puVar4 = local_38[-3];
    uVar5 = *(undefined4 *)((long)&local_38 + (long)puVar4 + 4);
    uVar6 = *(undefined4 *)((long)&local_30 + (long)puVar4);
    uVar7 = *(undefined4 *)((long)&local_30 + (long)puVar4 + 4);
    *(undefined4 *)((long)&output[1].exception.ptr.field_1 + 8) =
         *(undefined4 *)((long)&local_38 + (long)puVar4);
    *(undefined4 *)((long)&output[1].exception.ptr.field_1 + 0xc) = uVar5;
    *(undefined4 *)((long)&output[1].exception.ptr.field_1 + 0x10) = uVar6;
    *(undefined4 *)((long)&output[1].exception.ptr.field_1 + 0x14) = uVar7;
    *(undefined8 *)((long)&local_30 + (long)puVar4) = 0;
    plVar8 = local_28;
    output[1].exception.ptr.field_1.value.ownFile.content.ptr =
         (char *)&capnp::Capability::Client::typeinfo;
    output[1].exception.ptr.isSet = true;
    if (local_28 != (long *)0x0) {
      local_28 = (long *)0x0;
      (**(code **)*local_30)(local_30,(long)plVar8 + *(long *)(*plVar8 + -0x10));
    }
  }
  else if (output[1].exception.ptr.isSet == true) {
    output[1].exception.ptr.isSet = false;
    pAVar2 = output[1].exception.ptr.field_1.value.ownFile.content.disposer;
    if (pAVar2 != (ArrayDisposer *)0x0) {
      output[1].exception.ptr.field_1.value.ownFile.content.disposer = (ArrayDisposer *)0x0;
      puVar3 = (undefined8 *)output[1].exception.ptr.field_1.value.ownFile.content.size_;
      (**(code **)*puVar3)
                (puVar3,pAVar2->_vptr_ArrayDisposer[-2] + (long)&pAVar2->_vptr_ArrayDisposer);
    }
  }
  if (pEVar1 != output) {
    if ((output->exception).ptr.isSet == true) {
      (output->exception).ptr.isSet = false;
      Exception::~Exception(&(output->exception).ptr.field_1.value);
    }
    if ((pEVar1->exception).ptr.isSet == true) {
      Exception::Exception
                (&(output->exception).ptr.field_1.value,&(pEVar1->exception).ptr.field_1.value);
      (output->exception).ptr.isSet = true;
    }
  }
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_SOME(value, hubResult.value) {
      output.as<T>().value = copyOrAddRef(value);
    } else {
      output.as<T>().value = kj::none;
    }